

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_when(lys_ypr_ctx_conflict *pctx,lysp_when *when,int8_t *flag)

{
  uint local_34;
  int8_t local_21;
  int8_t *piStack_20;
  int8_t inner_flag;
  int8_t *flag_local;
  lysp_when *when_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  local_21 = '\0';
  if (when != (lysp_when *)0x0) {
    piStack_20 = flag;
    flag_local = (int8_t *)when;
    when_local = (lysp_when *)pctx;
    ypr_close_parent(pctx,flag);
    if (((ulong)when_local->dsc & 0x200000000) == 0) {
      local_34 = (uint)*(ushort *)&when_local->dsc << 1;
    }
    else {
      local_34 = 0;
    }
    ly_print_((ly_out *)when_local->cond,"%*s<when condition=\"",(ulong)local_34,"");
    lyxml_dump_text((ly_out *)when_local->cond,*(char **)flag_local,'\x01');
    ly_print_((ly_out *)when_local->cond,"\"");
    *(short *)&when_local->dsc = *(short *)&when_local->dsc + 1;
    yprp_extension_instances
              ((lys_ypr_ctx_conflict *)when_local,LY_STMT_WHEN,'\0',
               *(lysp_ext_instance **)(flag_local + 0x18),&local_21);
    ypr_description((lys_ypr_ctx_conflict *)when_local,*(char **)(flag_local + 8),
                    *(void **)(flag_local + 0x18),&local_21);
    ypr_reference((lys_ypr_ctx_conflict *)when_local,*(char **)(flag_local + 0x10),
                  *(void **)(flag_local + 0x18),&local_21);
    *(short *)&when_local->dsc = *(short *)&when_local->dsc + -1;
    ypr_close((lys_ypr_ctx_conflict *)when_local,"when",local_21);
  }
  return;
}

Assistant:

static void
yprp_when(struct lys_ypr_ctx *pctx, struct lysp_when *when, int8_t *flag)
{
    int8_t inner_flag = 0;

    if (!when) {
        return;
    }

    ypr_close_parent(pctx, flag);
    ly_print_(pctx->out, "%*s<when condition=\"", INDENT);
    lyxml_dump_text(pctx->out, when->cond, 1);
    ly_print_(pctx->out, "\"");

    LEVEL++;
    yprp_extension_instances(pctx, LY_STMT_WHEN, 0, when->exts, &inner_flag);
    ypr_description(pctx, when->dsc, when->exts, &inner_flag);
    ypr_reference(pctx, when->ref, when->exts, &inner_flag);
    LEVEL--;
    ypr_close(pctx, "when", inner_flag);
}